

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O3

dropt_char *
my_dropt_error_handler
          (dropt_error error,dropt_char *optionName,dropt_char *optionArgument,void *handlerData)

{
  dropt_char *pdVar1;
  
  if (error == 0x80) {
    pdVar1 = (dropt_char *)dropt_asprintf("Invalid IP address for option %s: %s");
    return pdVar1;
  }
  pdVar1 = (dropt_char *)dropt_default_error_handler();
  return pdVar1;
}

Assistant:

static dropt_char*
my_dropt_error_handler(dropt_error error, const dropt_char* optionName,
                       const dropt_char* optionArgument, void* handlerData)
{
#ifdef DROPT_NO_STRING_BUFFERS
    if (error == my_dropt_error_bad_ip_address)
    {
        return dropt_strdup(T("Invalid IP address"));
    }
    else
    {
        /* This is inefficient, but it's not important here. */
        dropt_char buf[256] = T("Failed on: ");
        safe_strncat(buf, ARRAY_LENGTH(buf), optionName);
        safe_strncat(buf, ARRAY_LENGTH(buf), T("="));
        safe_strncat(buf, ARRAY_LENGTH(buf), optionArgument ? optionArgument
                                                            : T("(null)"));
        return dropt_strdup(buf);
    }
#else
    if (error == my_dropt_error_bad_ip_address)
    {
        return dropt_asprintf(T("Invalid IP address for option %s: %s"), optionName, optionArgument);
    }
    else
    {
        return dropt_default_error_handler(error, optionName, optionArgument);
    }
#endif
}